

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_mul_2exp(__mpz_struct *r,__mpz_struct *u,mp_bitcnt_t bits)

{
  long n;
  ulong n_00;
  mp_limb_t mVar1;
  int local_68;
  mp_ptr local_60;
  int local_54;
  mp_limb_t cy;
  mp_ptr rp;
  uint shift;
  mp_size_t limbs;
  mp_size_t rn;
  mp_size_t un;
  mp_bitcnt_t bits_local;
  __mpz_struct *u_local;
  __mpz_struct *r_local;
  
  if (u->_mp_size < 0) {
    local_54 = -u->_mp_size;
  }
  else {
    local_54 = u->_mp_size;
  }
  n = (long)local_54;
  if (n == 0) {
    r->_mp_size = 0;
  }
  else {
    n_00 = bits >> 6;
    limbs = n + n_00 + (long)(int)(uint)((bits & 0x3f) != 0);
    if (r->_mp_alloc < limbs) {
      local_60 = mpz_realloc(r,limbs);
    }
    else {
      local_60 = r->_mp_d;
    }
    if ((bits & 0x3f) == 0) {
      mpn_copyd(local_60 + n_00,u->_mp_d,n);
    }
    else {
      mVar1 = mpn_lshift(local_60 + n_00,u->_mp_d,n,(uint)bits & 0x3f);
      local_60[limbs + -1] = mVar1;
      limbs = limbs - (int)(uint)(mVar1 == 0);
    }
    mpn_zero(local_60,n_00);
    local_68 = (int)limbs;
    if (u->_mp_size < 0) {
      local_68 = -local_68;
    }
    r->_mp_size = local_68;
  }
  return;
}

Assistant:

void
mpz_mul_2exp (mpz_t r, const mpz_t u, mp_bitcnt_t bits)
{
  mp_size_t un, rn;
  mp_size_t limbs;
  unsigned shift;
  mp_ptr rp;

  un = GMP_ABS (u->_mp_size);
  if (un == 0)
    {
      r->_mp_size = 0;
      return;
    }

  limbs = bits / GMP_LIMB_BITS;
  shift = bits % GMP_LIMB_BITS;

  rn = un + limbs + (shift > 0);
  rp = MPZ_REALLOC (r, rn);
  if (shift > 0)
    {
      mp_limb_t cy = mpn_lshift (rp + limbs, u->_mp_d, un, shift);
      rp[rn-1] = cy;
      rn -= (cy == 0);
    }
  else
    mpn_copyd (rp + limbs, u->_mp_d, un);

  mpn_zero (rp, limbs);

  r->_mp_size = (u->_mp_size < 0) ? - rn : rn;
}